

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::OpenGEX::OpenGEXImporter::CanRead
          (OpenGEXImporter *this,string *file,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,checkSig) != 0) {
    bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,file,CanRead::token,4,200,false,false)
    ;
    return bVar1;
  }
  bVar1 = BaseImporter::SimpleExtensionCheck(file,"ogex",(char *)0x0,(char *)0x0);
  return bVar1;
}

Assistant:

bool OpenGEXImporter::CanRead( const std::string &file, IOSystem *pIOHandler, bool checkSig ) const {
    bool canRead( false );
    if( !checkSig ) {
        canRead = SimpleExtensionCheck( file, "ogex" );
    } else {
        static const char *token[] = { "Metric", "GeometryNode", "VertexArray (attrib", "IndexArray" };
        canRead = BaseImporter::SearchFileHeaderForToken( pIOHandler, file, token, 4 );
    }

    return canRead;
}